

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O2

void plutovg_canvas_clip_preserve(plutovg_canvas_t *canvas)

{
  plutovg_state_t *ppVar1;
  
  ppVar1 = canvas->state;
  if (ppVar1->clipping == true) {
    plutovg_rasterize(&canvas->fill_spans,canvas->path,&ppVar1->matrix,&canvas->clip_rect,
                      (plutovg_stroke_data_t *)0x0,ppVar1->winding);
    plutovg_span_buffer_intersect
              (&canvas->clip_spans,&canvas->fill_spans,&canvas->state->clip_spans);
    plutovg_span_buffer_copy(&canvas->state->clip_spans,&canvas->clip_spans);
    return;
  }
  plutovg_rasterize(&ppVar1->clip_spans,canvas->path,&ppVar1->matrix,&canvas->clip_rect,
                    (plutovg_stroke_data_t *)0x0,ppVar1->winding);
  canvas->state->clipping = true;
  return;
}

Assistant:

void plutovg_canvas_clip_preserve(plutovg_canvas_t* canvas)
{
    if(canvas->state->clipping) {
        plutovg_rasterize(&canvas->fill_spans, canvas->path, &canvas->state->matrix, &canvas->clip_rect, NULL, canvas->state->winding);
        plutovg_span_buffer_intersect(&canvas->clip_spans, &canvas->fill_spans, &canvas->state->clip_spans);
        plutovg_span_buffer_copy(&canvas->state->clip_spans, &canvas->clip_spans);
    } else {
        plutovg_rasterize(&canvas->state->clip_spans, canvas->path, &canvas->state->matrix, &canvas->clip_rect, NULL, canvas->state->winding);
        canvas->state->clipping = true;
    }
}